

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_3,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  bool bVar1;
  float *pfVar2;
  int c;
  long lVar3;
  float *pfVar4;
  int col;
  long lVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  float fVar11;
  undefined8 local_68;
  float local_60;
  float afStack_58 [2];
  Matrix<float,_3,_2> res;
  float local_38 [2];
  Vector<float,_3> res_1;
  float fStack_24;
  float afStack_20 [6];
  long lVar9;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_68 = *(undefined8 *)(evalCtx->coords).m_data;
    fVar6 = (float)local_68;
    fVar7 = (float)((ulong)local_68 >> 0x20);
    local_60 = (evalCtx->coords).m_data[2];
  }
  else {
    local_68 = 0x3dcccccd3f8ccccd;
    local_60 = 0.5;
    fVar6 = (evalCtx->coords).m_data[0];
    fVar7 = (evalCtx->coords).m_data[1];
  }
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar6 = 0.5;
  }
  stack0xffffffffffffffd8 = 0;
  afStack_20[0] = 0.0;
  afStack_20[1] = 0.0;
  afStack_20[2] = 0.0;
  afStack_20[3] = 0.0;
  lVar3 = 0;
  pfVar2 = res_1.m_data + 2;
  bVar10 = true;
  do {
    bVar1 = bVar10;
    lVar5 = 0;
    auVar8 = _DAT_00ac4b30;
    do {
      bVar10 = SUB164(auVar8 ^ _DAT_00ac4b80,4) == -0x80000000 &&
               SUB164(auVar8 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
      if (bVar10) {
        fVar11 = 1.0;
        if (lVar3 != lVar5) {
          fVar11 = 0.0;
        }
        pfVar2[lVar5 * 2] = fVar11;
      }
      if (bVar10) {
        fVar11 = 1.0;
        if (lVar3 + -1 != lVar5) {
          fVar11 = 0.0;
        }
        pfVar2[lVar5 * 2 + 2] = fVar11;
      }
      lVar5 = lVar5 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
    } while (lVar5 != 4);
    lVar3 = 1;
    pfVar2 = &fStack_24;
    bVar10 = false;
  } while (bVar1);
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar7 = 1.0;
  }
  pfVar2 = res_1.m_data + 2;
  bVar10 = true;
  do {
    bVar1 = bVar10;
    lVar3 = 0;
    do {
      pfVar2[lVar3 * 2] = *(float *)((long)&local_68 + lVar3 * 4) * fVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pfVar2 = &fStack_24;
    fVar6 = fVar7;
    bVar10 = false;
  } while (bVar1);
  afStack_58[0] = 0.0;
  afStack_58[1] = 0.0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[2] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  lVar3 = 0;
  do {
    fVar6 = 1.0;
    if (lVar3 != 0) {
      fVar6 = 0.0;
    }
    res.m_data.m_data[0].m_data[lVar3 + -2] = fVar6;
    fVar6 = 1.0;
    if (lVar3 != 1) {
      fVar6 = 0.0;
    }
    res.m_data.m_data[0].m_data[lVar3 + 1] = fVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pfVar2 = res_1.m_data + 2;
  pfVar4 = afStack_58;
  bVar10 = true;
  do {
    bVar1 = bVar10;
    lVar3 = 0;
    do {
      pfVar4[lVar3] = pfVar2[lVar3 * 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pfVar2 = &fStack_24;
    pfVar4 = res.m_data.m_data[0].m_data + 1;
    bVar10 = false;
  } while (bVar1);
  res_1.m_data[0] = 0.0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3 + -2] =
         res.m_data.m_data[0].m_data[lVar3 + -2] + res.m_data.m_data[0].m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_20[0] = 0.0;
  afStack_20[1] = 1.4013e-45;
  afStack_20[2] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res_1.m_data[lVar3 + 2]] = res.m_data.m_data[1].m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}